

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<4,_8,_8>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 *puVar1;
  bool bVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  float *pfVar6;
  int col;
  long lVar7;
  undefined8 *puVar8;
  int c;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar15;
  undefined4 uVar16;
  float fVar17;
  float afStack_88 [2];
  Matrix<float,_2,_3> retVal;
  undefined1 auStack_68 [8];
  Mat3x2 m_1;
  undefined1 auStack_48 [8];
  Mat3x2 m;
  int aiStack_20 [6];
  long lVar14;
  
  puVar1 = (undefined8 *)((long)auStack_48 + 4);
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    puVar4 = (undefined8 *)auStack_48;
    bVar15 = true;
    do {
      bVar2 = bVar15;
      lVar7 = 0;
      auVar11 = _DAT_019f34d0;
      do {
        bVar15 = SUB164(auVar11 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar11 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar15) {
          uVar16 = 0x3f800000;
          if (lVar3 != lVar7) {
            uVar16 = 0;
          }
          *(undefined4 *)(puVar4 + lVar7) = uVar16;
        }
        if (bVar15) {
          uVar16 = 0x3f800000;
          if (lVar3 + -1 != lVar7) {
            uVar16 = 0;
          }
          *(undefined4 *)(puVar4 + lVar7 + 1) = uVar16;
        }
        lVar7 = lVar7 + 2;
        lVar14 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar14 + 2;
      } while (lVar7 != 4);
      lVar3 = 1;
      puVar4 = puVar1;
      bVar15 = false;
    } while (bVar2);
    auStack_48 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    m.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    m.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    m.m_data.m_data[0].m_data[0] = 0.0;
    m.m_data.m_data[0].m_data[1] = 0.0;
    m.m_data.m_data[1].m_data[0] = 0.0;
    m.m_data.m_data[1].m_data[1] = 0.0;
    lVar3 = 0;
    puVar4 = (undefined8 *)auStack_48;
    bVar15 = true;
    do {
      bVar2 = bVar15;
      lVar7 = 0;
      do {
        *(undefined4 *)(puVar4 + lVar7) =
             *(undefined4 *)((long)&s_constInMat3x2 + lVar3 + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar3 = 0xc;
      puVar4 = puVar1;
      bVar15 = false;
    } while (bVar2);
  }
  puVar4 = (undefined8 *)((long)auStack_68 + 4);
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    puVar5 = (undefined8 *)auStack_68;
    bVar15 = true;
    do {
      bVar2 = bVar15;
      lVar7 = 0;
      auVar12 = _DAT_019f34d0;
      do {
        bVar15 = SUB164(auVar12 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar12 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar15) {
          uVar16 = 0x3f800000;
          if (lVar3 != lVar7) {
            uVar16 = 0;
          }
          *(undefined4 *)(puVar5 + lVar7) = uVar16;
        }
        if (bVar15) {
          uVar16 = 0x3f800000;
          if (lVar3 + -1 != lVar7) {
            uVar16 = 0;
          }
          *(undefined4 *)(puVar5 + lVar7 + 1) = uVar16;
        }
        lVar7 = lVar7 + 2;
        lVar14 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar14 + 2;
      } while (lVar7 != 4);
      lVar3 = 1;
      puVar5 = puVar4;
      bVar15 = false;
    } while (bVar2);
    auStack_68 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    m_1.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    m_1.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    auStack_68 = (undefined1  [8])0x0;
    m_1.m_data.m_data[0].m_data[0] = 0.0;
    m_1.m_data.m_data[0].m_data[1] = 0.0;
    m_1.m_data.m_data[1].m_data[0] = 0.0;
    m_1.m_data.m_data[1].m_data[1] = 0.0;
    lVar3 = 0;
    puVar5 = (undefined8 *)auStack_68;
    bVar15 = true;
    do {
      bVar2 = bVar15;
      lVar7 = 0;
      do {
        *(undefined4 *)(puVar5 + lVar7) = *(undefined4 *)((long)&DAT_01beae38 + lVar7 * 4 + lVar3);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar3 = 0xc;
      puVar5 = puVar4;
      bVar15 = false;
    } while (bVar2);
  }
  afStack_88[0] = 0.0;
  afStack_88[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  pfVar6 = afStack_88;
  bVar15 = true;
  do {
    bVar2 = bVar15;
    lVar7 = 0;
    auVar13 = _DAT_019f34d0;
    do {
      bVar15 = SUB164(auVar13 ^ _DAT_019ec5b0,4) == -0x80000000 &&
               SUB164(auVar13 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar15) {
        fVar17 = 1.0;
        if (lVar3 != lVar7) {
          fVar17 = 0.0;
        }
        pfVar6[lVar7 * 2] = fVar17;
      }
      if (bVar15) {
        fVar17 = 1.0;
        if (lVar3 + -1 != lVar7) {
          fVar17 = 0.0;
        }
        pfVar6[lVar7 * 2 + 2] = fVar17;
      }
      lVar7 = lVar7 + 2;
      lVar14 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar14 + 2;
    } while (lVar7 != 4);
    lVar3 = 1;
    pfVar6 = afStack_88 + 1;
    bVar15 = false;
  } while (bVar2);
  pfVar6 = afStack_88;
  puVar5 = (undefined8 *)auStack_68;
  puVar8 = (undefined8 *)auStack_48;
  bVar15 = true;
  do {
    bVar2 = bVar15;
    lVar3 = 0;
    do {
      pfVar6[lVar3 * 2] = *(float *)(puVar8 + lVar3) * *(float *)(puVar5 + lVar3);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    pfVar6 = afStack_88 + 1;
    puVar5 = puVar4;
    puVar8 = puVar1;
    bVar15 = false;
  } while (bVar2);
  fVar9 = afStack_88[0] + afStack_88[1];
  fVar10 = retVal.m_data.m_data[0].m_data[1] + retVal.m_data.m_data[0].m_data[0];
  m.m_data.m_data[2].m_data[0] = fVar9;
  m.m_data.m_data[2].m_data[1] = fVar10;
  aiStack_20[2] = 0;
  aiStack_20[3] = 1;
  aiStack_20[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_20[lVar3]] = m.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}